

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::CComputeBase::Cleanup(CComputeBase *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->_program);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->_programCompute);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->_vao);
  if (this->_ebo != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_ebo);
  }
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferCoords);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferColors);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferIndirect);
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glViewport
            (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar1) + 4));
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisableVertexAttribArray(1);
		glDisableVertexAttribArray(0);
		glDeleteProgram(_program);
		glDeleteProgram(_programCompute);
		glDeleteVertexArrays(1, &_vao);
		if (_ebo)
			glDeleteBuffers(1, &_ebo);
		glDeleteBuffers(1, &_bufferCoords);
		glDeleteBuffers(1, &_bufferColors);
		glDeleteBuffers(1, &_bufferIndirect);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		return NO_ERROR;
	}